

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void mainloop(trans2p *t)

{
  void *__buf;
  ev_impl *peVar1;
  void *pvVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  ev_event ev;
  ev_event local_58;
  packet_state *local_40;
  tunif *local_38;
  
  peVar1 = t->impl;
  puts("mainloop");
  local_38 = &t->tun;
  local_40 = &t->pkt;
  do {
    iVar3 = (*(t->api).poll)(peVar1,0,&local_58);
    pvVar2 = local_58.ptr;
    if (0 < iVar3) {
      if (((byte)local_58.flags & 1) != 0) {
        __buf = (void *)((long)local_58.ptr + 8);
        do {
          sVar4 = read(local_58.fd,__buf,0x800);
          if (sVar4 < 1) {
            if (sVar4 == 0) {
              close(local_58.fd);
              (*(t->api).del)(peVar1,local_58.fd);
              break;
            }
LAB_0010b50f:
            piVar5 = __errno_location();
            if (*piVar5 != 0xb) {
              perror("read");
            }
          }
          else {
            if (*(code **)((long)pvVar2 + 0x808) == (code *)0x0) goto LAB_0010b50f;
            (**(code **)((long)pvVar2 + 0x808))(sVar4,pvVar2);
          }
        } while (0 < sVar4);
      }
      tunif_tick(local_38,&t->i2cp,local_40);
      i2cp_tick(&t->i2cp);
      if ((((byte)local_58.flags & 2) != 0) && (*(code **)((long)pvVar2 + 0x810) != (code *)0x0)) {
        (**(code **)((long)pvVar2 + 0x810))(pvVar2);
      }
    }
    if (iVar3 == -1) {
      return;
    }
  } while( true );
}

Assistant:

void mainloop(struct trans2p * t)
{
  struct ev_api * api = &t->api;
  struct ev_impl * impl = t->impl;
  struct ev_event ev;
  struct handler * h;
  int res;
  ssize_t count;
  printf("mainloop\n");
  do
  {
    res = api->poll(impl, 0, &ev);
    if(res > 0)
    {
      h = (struct handler *) ev.ptr;
      if(ev.flags & EV_READ)
      {
        do
        {
          count = read(ev.fd, h->readbuf, sizeof(h->readbuf));
          if(count > 0 && h->read)
          {
            h->read(count, h);
          }
          else if (count == 0)
          {
            // connection closed
            close(ev.fd);
            api->del(impl, ev.fd);
          }
          else if (errno != EAGAIN)
          {
            perror("read");
          }
        }
        while(count > 0);     
      }
      tick(t);
      if (ev.flags & EV_WRITE)
      {
        if(h->write)
          h->write(h);
      }
    }
  }
  while(res != -1);
}